

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8to1_int8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse
               (Mat *kernel,Mat *kernel_tm_pack8to1,int inch,int outch,Option *opt)

{
  int in_ECX;
  long lVar1;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  int i_3;
  int q_2;
  short *g00_1;
  int k_1;
  Mat g0_1;
  Mat k0_2;
  short *k31;
  short *k21;
  short *k11;
  short *k01;
  short *k30;
  short *k20;
  short *k10;
  short *k00;
  int i_2;
  int q_1;
  short *g00;
  int k;
  Mat g0;
  Mat k3;
  Mat k2_1;
  Mat k1_1;
  Mat k0_1;
  int p;
  int i_1;
  short *tmpp;
  int j;
  int i;
  short tmp [6] [3];
  char *k2;
  char *k1;
  char *k0;
  short *kernel_tm0;
  char *kernel0;
  int q;
  int p_1;
  short ktm [6] [3];
  Mat kernel_tm;
  Mat *m_7;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffff390;
  int _elempack;
  void **ppvVar2;
  size_t in_stack_fffffffffffff398;
  undefined8 in_stack_fffffffffffff3a0;
  int _c;
  undefined8 in_stack_fffffffffffff3a8;
  Mat *in_stack_fffffffffffff3b0;
  Allocator *in_stack_fffffffffffff410;
  int local_af8;
  int local_af4;
  undefined2 *local_af0;
  int local_ae4;
  undefined8 local_ae0;
  undefined8 local_ad8;
  undefined8 local_ad0;
  undefined4 local_ac8;
  long local_ac0;
  undefined4 local_ab8;
  undefined4 local_ab4;
  undefined4 local_ab0;
  undefined4 local_aac;
  undefined4 local_aa8;
  undefined8 local_aa0;
  undefined8 local_a98;
  undefined8 local_a90;
  undefined8 local_a88;
  undefined4 local_a80;
  long *local_a78;
  undefined4 local_a70;
  undefined4 local_a6c;
  undefined4 local_a68;
  undefined4 local_a64;
  undefined4 local_a60;
  undefined8 local_a58;
  void *local_a50;
  void *local_a48;
  void *local_a40;
  void *local_a38;
  void *local_a30;
  void *local_a28;
  void *local_a20;
  void *local_a18;
  int local_a10;
  int local_a0c;
  undefined2 *local_a08;
  int local_9fc;
  undefined8 local_9f8;
  undefined8 local_9f0;
  undefined8 local_9e8;
  undefined4 local_9e0;
  long local_9d8;
  undefined4 local_9d0;
  undefined4 local_9cc;
  undefined4 local_9c8;
  undefined4 local_9c4;
  undefined4 local_9c0;
  undefined8 local_9b8;
  undefined8 local_9b0;
  undefined8 local_9a8;
  undefined8 local_9a0;
  undefined4 local_998;
  long *local_990;
  undefined4 local_988;
  undefined4 local_984;
  undefined4 local_980;
  undefined4 local_97c;
  undefined4 local_978;
  undefined8 local_970;
  undefined8 local_968;
  undefined8 local_960;
  undefined8 local_958;
  undefined4 local_950;
  long *local_948;
  undefined4 local_940;
  undefined4 local_93c;
  undefined4 local_938;
  undefined4 local_934;
  undefined4 local_930;
  undefined8 local_928;
  undefined8 local_920;
  undefined8 local_918;
  undefined8 local_910;
  undefined4 local_908;
  long *local_900;
  undefined4 local_8f8;
  undefined4 local_8f4;
  undefined4 local_8f0;
  undefined4 local_8ec;
  undefined4 local_8e8;
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined4 local_8c0;
  long *local_8b8;
  undefined4 local_8b0;
  undefined4 local_8ac;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined4 local_8a0;
  undefined8 local_898;
  int local_890;
  int local_88c;
  short *local_888;
  int local_880;
  int local_87c;
  short local_878 [20];
  char *local_850;
  char *local_848;
  char *local_840;
  undefined8 local_828;
  undefined8 local_820;
  undefined8 local_818;
  undefined4 local_810;
  long *local_808;
  undefined4 local_800;
  undefined4 local_7fc;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  undefined8 local_7e8;
  void *local_7e0;
  char *local_7d8;
  int local_7d0;
  int local_7cc;
  short local_7c8 [24];
  void *local_798;
  int *local_790;
  long local_788;
  undefined4 local_780;
  long *local_778;
  undefined4 local_770;
  int local_76c;
  int local_768;
  undefined4 local_764;
  undefined4 local_760;
  long local_758;
  int local_748;
  int local_744;
  long *local_740;
  long *local_738;
  undefined1 local_72d;
  int local_72c;
  undefined8 *local_720;
  undefined1 local_715;
  int local_714;
  void **local_710;
  undefined8 *local_708;
  undefined1 local_6fd;
  int local_6fc;
  undefined8 *local_6f0;
  undefined1 local_6e5;
  int local_6e4;
  void **local_6e0;
  undefined8 *local_6d8;
  undefined1 local_6cd;
  int local_6cc;
  void **local_6c8;
  undefined8 *local_6c0;
  undefined1 local_6b5;
  int local_6b4;
  void **local_6b0;
  undefined8 *local_6a8;
  undefined1 local_69d;
  int local_69c;
  void **local_698;
  undefined8 *local_690;
  undefined1 local_685;
  int local_684;
  void **local_680;
  undefined8 *local_678;
  undefined8 *local_630;
  undefined8 *local_620;
  undefined8 *local_610;
  undefined8 *local_600;
  undefined8 *local_5f0;
  undefined8 *local_5e0;
  undefined8 *local_5d0;
  undefined8 *local_5c0;
  void **local_5b0;
  long *local_598;
  undefined4 local_58c;
  long local_588;
  void *local_580;
  undefined4 local_574;
  int local_570;
  int local_56c;
  undefined8 *local_568;
  long *local_560;
  undefined4 local_554;
  long local_550;
  void *local_548;
  undefined4 local_53c;
  int local_538;
  int local_534;
  undefined8 *local_530;
  long *local_528;
  undefined4 local_51c;
  long local_518;
  void *local_510;
  undefined4 local_504;
  int local_500;
  int local_4fc;
  undefined8 *local_4f8;
  long *local_4f0;
  undefined4 local_4e4;
  long local_4e0;
  void *local_4d8;
  undefined4 local_4cc;
  int local_4c8;
  int local_4c4;
  undefined8 *local_4c0;
  long *local_4b8;
  undefined4 local_4ac;
  long local_4a8;
  void *local_4a0;
  undefined4 local_494;
  int local_490;
  int local_48c;
  undefined8 *local_488;
  long local_480;
  undefined4 local_474;
  long local_470;
  long local_468;
  undefined4 local_45c;
  int local_458;
  int local_454;
  undefined8 *local_450;
  long *local_448;
  undefined4 local_43c;
  long local_438;
  void *local_430;
  undefined4 local_424;
  int local_420;
  int local_41c;
  undefined8 *local_418;
  long local_410;
  undefined4 local_404;
  long local_400;
  long local_3f8;
  undefined4 local_3ec;
  int local_3e8;
  int local_3e4;
  undefined8 *local_3e0;
  undefined4 local_3d4;
  long local_3d0;
  undefined4 local_3c4;
  long local_3c0;
  undefined4 local_3b4;
  long local_3b0;
  undefined4 local_3a4;
  long local_3a0;
  undefined4 local_394;
  long local_390;
  undefined4 local_384;
  long local_380;
  undefined4 local_374;
  long local_370;
  undefined4 local_364;
  long local_360;
  int local_348;
  undefined4 local_344;
  void **local_340;
  undefined8 *local_320;
  undefined8 *local_300;
  undefined8 *local_2e0;
  undefined8 *local_2c0;
  undefined8 *local_2a0;
  undefined8 *local_280;
  undefined8 *local_260;
  undefined8 *local_240;
  void *local_f8;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined4 local_cc;
  void **local_c8;
  int local_bc;
  undefined8 *local_b8;
  int local_ac;
  undefined8 *local_a8;
  int local_9c;
  undefined8 *local_98;
  int local_8c;
  undefined8 *local_88;
  int local_7c;
  undefined8 *local_78;
  int local_6c;
  undefined8 *local_68;
  int local_5c;
  undefined8 *local_58;
  int local_4c;
  undefined8 *local_48;
  int local_3c;
  undefined8 *local_38;
  int local_2c;
  undefined8 *local_28;
  int local_1c;
  undefined8 *local_18;
  int local_c;
  undefined8 *local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffff3a0 >> 0x20);
  local_c8 = &local_798;
  local_cc = 0x24;
  local_e0 = 2;
  local_e8 = 0;
  local_798 = (void *)0x0;
  local_790 = (int *)0x0;
  local_788 = 0;
  local_780 = 0;
  local_778 = (long *)0x0;
  local_770 = 0;
  local_76c = 0;
  local_768 = 0;
  local_764 = 0;
  local_760 = 0;
  local_758 = 0;
  local_748 = in_ECX;
  local_744 = in_EDX;
  local_740 = in_RSI;
  local_738 = in_RDI;
  Mat::create(in_stack_fffffffffffff3b0,(int)((ulong)in_stack_fffffffffffff3a8 >> 0x20),
              (int)in_stack_fffffffffffff3a8,_c,in_stack_fffffffffffff398,in_stack_fffffffffffff390)
  ;
  _elempack = (int)((ulong)in_stack_fffffffffffff390 >> 0x20);
  memcpy(local_7c8,&DAT_01f07520,0x24);
  for (local_7cc = 0; local_7cc < local_748; local_7cc = local_7cc + 1) {
    for (local_7d0 = 0; local_7d0 < local_744; local_7d0 = local_7d0 + 1) {
      local_840 = (char *)(*local_738 + (long)(local_7cc * local_744 * 9) + (long)(local_7d0 * 9));
      local_678 = &local_828;
      local_680 = &local_798;
      local_580 = (void *)((long)local_798 + local_758 * local_7cc * local_788);
      local_568 = &local_828;
      local_360 = (long)local_76c * (long)local_768 * local_788;
      local_808 = local_778;
      local_364 = 0x10;
      local_56c = local_76c;
      local_570 = local_768;
      local_574 = local_764;
      local_588 = local_788;
      local_58c = local_780;
      local_598 = local_778;
      local_684 = local_7cc;
      local_685 = 1;
      local_98 = &local_828;
      local_9c = local_7d0;
      local_7e0 = (void *)((long)local_580 + (long)local_76c * (long)local_7d0 * local_788);
      local_630 = &local_828;
      local_828 = 0;
      local_818 = 0;
      local_810 = 0;
      local_800 = 0;
      local_7fc = 0;
      local_7f8 = 0;
      local_7f4 = 0;
      local_7f0 = 0;
      local_7e8 = 0;
      local_820 = 0;
      local_848 = local_840 + 3;
      local_850 = local_840 + 6;
      for (local_87c = 0; local_87c < 6; local_87c = local_87c + 1) {
        local_878[(long)local_87c * 3] =
             (short)*local_840 * local_7c8[(long)local_87c * 3] +
             (short)local_840[1] * local_7c8[(long)local_87c * 3 + 1] +
             (short)local_840[2] * local_7c8[(long)local_87c * 3 + 2];
        local_878[(long)local_87c * 3 + 1] =
             (short)*local_848 * local_7c8[(long)local_87c * 3] +
             (short)local_840[4] * local_7c8[(long)local_87c * 3 + 1] +
             (short)local_840[5] * local_7c8[(long)local_87c * 3 + 2];
        local_878[(long)local_87c * 3 + 2] =
             (short)*local_850 * local_7c8[(long)local_87c * 3] +
             (short)local_840[7] * local_7c8[(long)local_87c * 3 + 1] +
             (short)local_840[8] * local_7c8[(long)local_87c * 3 + 2];
      }
      for (local_880 = 0; local_880 < 6; local_880 = local_880 + 1) {
        lVar1 = (long)local_880;
        local_888 = local_878 + lVar1 * 3;
        for (local_88c = 0; local_88c < 6; local_88c = local_88c + 1) {
          *(short *)((long)local_7e0 + (long)(local_880 * 6 + local_88c) * 2) =
               *local_888 * local_7c8[(long)local_88c * 3] +
               local_878[lVar1 * 3 + 1] * local_7c8[(long)local_88c * 3 + 1] +
               local_878[lVar1 * 3 + 2] * local_7c8[(long)local_88c * 3 + 2];
        }
      }
      local_7d8 = local_840;
      local_240 = local_630;
    }
  }
  Mat::create(in_stack_fffffffffffff3b0,(int)((ulong)in_stack_fffffffffffff3a8 >> 0x20),
              (int)in_stack_fffffffffffff3a8,_c,in_stack_fffffffffffff398,_elempack,
              in_stack_fffffffffffff410);
  for (local_890 = 0; local_890 + 3 < local_748; local_890 = local_890 + 4) {
    local_690 = &local_8d8;
    local_698 = &local_798;
    local_548 = (void *)((long)local_798 + local_758 * local_890 * local_788);
    local_530 = &local_8d8;
    local_370 = (long)local_76c * (long)local_768 * local_788;
    local_6b4 = local_890 + 1;
    local_6a8 = &local_920;
    local_6b0 = &local_798;
    local_510 = (void *)((long)local_798 + local_758 * local_6b4 * local_788);
    local_4f8 = &local_920;
    local_380 = (long)local_76c * (long)local_768 * local_788;
    local_6cc = local_890 + 2;
    local_6c0 = &local_968;
    local_6c8 = &local_798;
    local_4d8 = (void *)((long)local_798 + local_758 * local_6cc * local_788);
    local_4c0 = &local_968;
    local_390 = (long)local_76c * (long)local_768 * local_788;
    local_6e4 = local_890 + 3;
    local_6d8 = &local_9b0;
    local_6e0 = &local_798;
    local_4a0 = (void *)((long)local_798 + local_758 * local_6e4 * local_788);
    local_488 = &local_9b0;
    local_3a0 = (long)local_76c * (long)local_768 * local_788;
    local_6fc = local_890 / 4;
    local_6f0 = &local_9f8;
    local_454 = *(int *)((long)local_740 + 0x2c);
    local_458 = (int)local_740[6];
    local_45c = *(undefined4 *)((long)local_740 + 0x34);
    local_468 = *local_740 + local_740[8] * (long)local_6fc * local_740[2];
    local_470 = local_740[2];
    local_474 = (undefined4)local_740[3];
    local_480 = local_740[4];
    local_450 = &local_9f8;
    local_3b0 = (long)local_454 * (long)local_458 * local_470;
    for (local_9fc = 0; local_9fc < 0x24; local_9fc = local_9fc + 1) {
      local_a8 = &local_9f8;
      local_ac = local_9fc;
      local_a08 = (undefined2 *)(local_468 + (long)local_454 * (long)local_9fc * local_470);
      for (local_a0c = 0; local_a0c + 7 < local_744; local_a0c = local_a0c + 8) {
        for (local_a10 = 0; local_a10 < 4; local_a10 = local_a10 + 1) {
          local_c = local_a0c + local_a10 * 2;
          local_8 = &local_8d8;
          local_a18 = (void *)((long)local_548 + (long)local_76c * (long)local_c * local_788);
          local_1c = local_a0c + local_a10 * 2;
          local_18 = &local_920;
          local_a20 = (void *)((long)local_510 + (long)local_76c * (long)local_1c * local_788);
          local_2c = local_a0c + local_a10 * 2;
          local_28 = &local_968;
          local_a28 = (void *)((long)local_4d8 + (long)local_76c * (long)local_2c * local_788);
          local_3c = local_a0c + local_a10 * 2;
          local_38 = &local_9b0;
          local_a30 = (void *)((long)local_4a0 + (long)local_76c * (long)local_3c * local_788);
          local_4c = local_a0c + local_a10 * 2 + 1;
          local_48 = &local_8d8;
          local_a38 = (void *)((long)local_548 + (long)local_76c * (long)local_4c * local_788);
          local_5c = local_a0c + local_a10 * 2 + 1;
          local_58 = &local_920;
          local_a40 = (void *)((long)local_510 + (long)local_76c * (long)local_5c * local_788);
          local_6c = local_a0c + local_a10 * 2 + 1;
          local_68 = &local_968;
          local_a48 = (void *)((long)local_4d8 + (long)local_76c * (long)local_6c * local_788);
          local_7c = local_a0c + local_a10 * 2 + 1;
          local_78 = &local_9b0;
          local_a50 = (void *)((long)local_4a0 + (long)local_76c * (long)local_7c * local_788);
          *local_a08 = *(undefined2 *)((long)local_a18 + (long)local_9fc * 2);
          local_a08[1] = *(undefined2 *)((long)local_a38 + (long)local_9fc * 2);
          local_a08[2] = *(undefined2 *)((long)local_a20 + (long)local_9fc * 2);
          local_a08[3] = *(undefined2 *)((long)local_a40 + (long)local_9fc * 2);
          local_a08[4] = *(undefined2 *)((long)local_a28 + (long)local_9fc * 2);
          local_a08[5] = *(undefined2 *)((long)local_a48 + (long)local_9fc * 2);
          local_a08[6] = *(undefined2 *)((long)local_a30 + (long)local_9fc * 2);
          local_a08[7] = *(undefined2 *)((long)local_a50 + (long)local_9fc * 2);
          local_a08 = local_a08 + 8;
        }
      }
    }
    local_620 = &local_9f8;
    local_610 = &local_9b0;
    local_600 = &local_968;
    local_5f0 = &local_920;
    local_8b8 = local_778;
    local_900 = local_778;
    local_930 = 0;
    local_934 = 0;
    local_938 = 0;
    local_93c = 0;
    local_948 = local_778;
    local_950 = 0;
    local_958 = 0;
    local_960 = 0;
    local_968 = 0;
    local_978 = 0;
    local_97c = 0;
    local_980 = 0;
    local_984 = 0;
    local_990 = local_778;
    local_998 = 0;
    local_9a0 = 0;
    local_9a8 = 0;
    local_9b0 = 0;
    local_9c0 = 0;
    local_9c4 = 0;
    local_9c8 = 0;
    local_9cc = 0;
    local_9e0 = 0;
    local_9e8 = 0;
    local_9f0 = 0;
    local_9f8 = 0;
    local_374 = 0x10;
    local_384 = 0x10;
    local_394 = 0x10;
    local_3a4 = 0x10;
    local_3b4 = 0x10;
    local_48c = local_76c;
    local_490 = local_768;
    local_494 = local_764;
    local_4a8 = local_788;
    local_4ac = local_780;
    local_4b8 = local_778;
    local_4c4 = local_76c;
    local_4c8 = local_768;
    local_4cc = local_764;
    local_4e0 = local_788;
    local_4e4 = local_780;
    local_4f0 = local_778;
    local_4fc = local_76c;
    local_500 = local_768;
    local_504 = local_764;
    local_518 = local_788;
    local_51c = local_780;
    local_528 = local_778;
    local_534 = local_76c;
    local_538 = local_768;
    local_53c = local_764;
    local_550 = local_788;
    local_554 = local_780;
    local_560 = local_778;
    local_69c = local_890;
    local_69d = 1;
    local_6b5 = 1;
    local_6cd = 1;
    local_6e5 = 1;
    local_6fd = 1;
    local_928 = 0;
    local_940 = 0;
    local_970 = 0;
    local_988 = 0;
    local_9b8 = 0;
    local_9d0 = 0;
    local_920 = 0;
    local_910 = 0;
    local_908 = 0;
    local_8f8 = 0;
    local_8f4 = 0;
    local_8f0 = 0;
    local_8ec = 0;
    local_8e8 = 0;
    local_8e0 = 0;
    local_918 = 0;
    local_5e0 = &local_8d8;
    local_8d8 = 0;
    local_8c8 = 0;
    local_8c0 = 0;
    local_8b0 = 0;
    local_8ac = 0;
    local_8a8 = 0;
    local_8a4 = 0;
    local_8a0 = 0;
    local_898 = 0;
    local_8d0 = 0;
    local_2e0 = local_5e0;
    local_2c0 = local_5f0;
    local_2a0 = local_600;
    local_280 = local_610;
    local_260 = local_620;
    local_9d8 = local_480;
  }
  for (; local_890 < local_748; local_890 = local_890 + 1) {
    local_708 = &local_a98;
    local_710 = &local_798;
    local_430 = (void *)((long)local_798 + local_758 * local_890 * local_788);
    local_418 = &local_a98;
    local_3c0 = (long)local_76c * (long)local_768 * local_788;
    local_72c = local_890 / 4 + local_890 % 4;
    local_720 = &local_ae0;
    local_3e4 = *(int *)((long)local_740 + 0x2c);
    local_3e8 = (int)local_740[6];
    local_3ec = *(undefined4 *)((long)local_740 + 0x34);
    local_3f8 = *local_740 + local_740[8] * (long)local_72c * local_740[2];
    local_400 = local_740[2];
    local_404 = (undefined4)local_740[3];
    local_410 = local_740[4];
    local_3e0 = &local_ae0;
    local_3d0 = (long)local_3e4 * (long)local_3e8 * local_400;
    for (local_ae4 = 0; local_ae4 < 0x24; local_ae4 = local_ae4 + 1) {
      local_b8 = &local_ae0;
      local_bc = local_ae4;
      local_af0 = (undefined2 *)(local_3f8 + (long)local_3e4 * (long)local_ae4 * local_400);
      for (local_af4 = 0; local_af4 + 7 < local_744; local_af4 = local_af4 + 8) {
        for (local_af8 = 0; local_af8 < 8; local_af8 = local_af8 + 1) {
          local_8c = local_af4 + local_af8;
          local_88 = &local_a98;
          *local_af0 = *(undefined2 *)
                        ((long)local_430 +
                        (long)local_ae4 * 2 + (long)local_76c * (long)local_8c * local_788);
          local_af0 = local_af0 + 1;
        }
      }
    }
    local_5d0 = &local_ae0;
    local_ae0 = 0;
    local_ad0 = 0;
    local_ac8 = 0;
    local_ab8 = 0;
    local_ab4 = 0;
    local_ab0 = 0;
    local_aac = 0;
    local_aa8 = 0;
    local_aa0 = 0;
    local_ad8 = 0;
    local_5c0 = &local_a98;
    local_a78 = local_778;
    local_3c4 = 0x10;
    local_3d4 = 0x10;
    local_41c = local_76c;
    local_420 = local_768;
    local_424 = local_764;
    local_438 = local_788;
    local_43c = local_780;
    local_448 = local_778;
    local_714 = local_890;
    local_715 = 1;
    local_72d = 1;
    local_a98 = 0;
    local_a88 = 0;
    local_a80 = 0;
    local_a70 = 0;
    local_a6c = 0;
    local_a68 = 0;
    local_a64 = 0;
    local_a60 = 0;
    local_a58 = 0;
    local_a90 = 0;
    local_320 = local_5c0;
    local_300 = local_5d0;
    local_ac0 = local_410;
  }
  ppvVar2 = &local_798;
  if (local_790 != (int *)0x0) {
    local_344 = 0xffffffff;
    LOCK();
    local_348 = *local_790;
    *local_790 = *local_790 + -1;
    UNLOCK();
    if (local_348 == 1) {
      local_5b0 = ppvVar2;
      local_340 = ppvVar2;
      if (local_778 == (long *)0x0) {
        local_f8 = local_798;
        if (local_798 != (void *)0x0) {
          free(local_798);
        }
      }
      else {
        (**(code **)(*local_778 + 0x18))(local_778,local_798);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(const Mat& kernel, Mat& kernel_tm_pack8to1, int inch, int outch, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx512vnni(kernel, kernel_tm_pack8to1, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avxvnni(kernel, kernel_tm_pack8to1, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx2(kernel, kernel_tm_pack8to1, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_xop(kernel, kernel_tm_pack8to1, inch, outch, opt);
        return;
    }
#endif
#endif

    // winograd43 transform kernel
    Mat kernel_tm(6 * 6, inch, outch, (size_t)2u);

    const short ktm[6][3] = {
        {6, 0, 0},
        {-4, -4, -4},
        {-4, 4, -4},
        {1, 2, 4},
        {1, -2, 4},
        {0, 0, 6}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const signed char* kernel0 = (const signed char*)kernel + p * inch * 9 + q * 9;
            short* kernel_tm0 = kernel_tm.channel(p).row<short>(q);

            // transform kernel
            const signed char* k0 = kernel0;
            const signed char* k1 = kernel0 + 3;
            const signed char* k2 = kernel0 + 6;

            // h
            short tmp[6][3];
            for (int i = 0; i < 6; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 6; j++)
            {
                short* tmpp = &tmp[j][0];

                for (int i = 0; i < 6; i++)
                {
                    kernel_tm0[j * 6 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 36-inch-outch
    // dst = 4b-8a-inch/8a-36-outch/4b
    kernel_tm_pack8to1.create(8 * inch / 8, 36, outch / 4 + outch % 4, (size_t)2u * 4, 4);

    int p = 0;
    for (; p + 3 < outch; p += 4)
    {
        const Mat k0 = kernel_tm.channel(p);
        const Mat k1 = kernel_tm.channel(p + 1);
        const Mat k2 = kernel_tm.channel(p + 2);
        const Mat k3 = kernel_tm.channel(p + 3);

        Mat g0 = kernel_tm_pack8to1.channel(p / 4);

        for (int k = 0; k < 36; k++)
        {
            short* g00 = g0.row<short>(k);

            for (int q = 0; q + 7 < inch; q += 8)
            {
#if __AVXVNNI__ || __AVX512VNNI__ || __XOP__
                for (int i = 0; i < 4; i++)
                {
                    const short* k00 = k0.row<const short>(q + i * 2);
                    const short* k10 = k1.row<const short>(q + i * 2);
                    const short* k20 = k2.row<const short>(q + i * 2);
                    const short* k30 = k3.row<const short>(q + i * 2);

                    const short* k01 = k0.row<const short>(q + i * 2 + 1);
                    const short* k11 = k1.row<const short>(q + i * 2 + 1);
                    const short* k21 = k2.row<const short>(q + i * 2 + 1);
                    const short* k31 = k3.row<const short>(q + i * 2 + 1);

                    g00[0] = k00[k];
                    g00[1] = k01[k];
                    g00[2] = k10[k];
                    g00[3] = k11[k];
                    g00[4] = k20[k];
                    g00[5] = k21[k];
                    g00[6] = k30[k];
                    g00[7] = k31[k];

                    g00 += 8;
                }
#else
                for (int i = 0; i < 8; i++)
                {
                    g00[0] = k0.row<const short>(q + i)[k];
                    g00[1] = k1.row<const short>(q + i)[k];
                    g00[2] = k2.row<const short>(q + i)[k];
                    g00[3] = k3.row<const short>(q + i)[k];

                    g00 += 4;
                }
#endif
            }
        }
    }
    for (; p < outch; p++)
    {
        const Mat k0 = kernel_tm.channel(p);

        Mat g0 = kernel_tm_pack8to1.channel(p / 4 + p % 4);

        for (int k = 0; k < 36; k++)
        {
            short* g00 = g0.row<short>(k);

            for (int q = 0; q + 7 < inch; q += 8)
            {
                for (int i = 0; i < 8; i++)
                {
                    g00[0] = k0.row<const short>(q + i)[k];

                    g00 += 1;
                }
            }
        }
    }
}